

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool MeCab::Viterbi::forwardbackward(Lattice *lattice)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long *in_RDI;
  float fVar5;
  double dVar6;
  double dVar7;
  Path *path;
  Node *node_2;
  int pos_2;
  double Z;
  Node *node_1;
  int pos_1;
  Node *node;
  int pos;
  double theta;
  size_t len;
  Node **begin_node_list;
  Node **end_node_list;
  double in_stack_ffffffffffffff88;
  Node *in_stack_ffffffffffffff90;
  long local_68;
  int local_5c;
  long local_50;
  int local_44;
  long local_40;
  int local_34;
  
  uVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,8);
  if ((uVar1 & 1) != 0) {
    plVar2 = (long *)(**(code **)(*in_RDI + 0x28))();
    lVar3 = (**(code **)(*in_RDI + 0x20))();
    lVar4 = (**(code **)(*in_RDI + 0x58))();
    fVar5 = (float)(**(code **)(*in_RDI + 0x78))();
    *(undefined4 *)(*plVar2 + 0x54) = 0;
    for (local_34 = 0; local_34 <= lVar4; local_34 = local_34 + 1) {
      for (local_40 = *(long *)(lVar3 + (long)local_34 * 8); local_40 != 0;
          local_40 = *(long *)(local_40 + 0x18)) {
        anon_unknown_14::calc_alpha(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    *(undefined4 *)(*(long *)(lVar3 + lVar4 * 8) + 0x58) = 0;
    for (local_44 = (int)lVar4; -1 < local_44; local_44 = local_44 + -1) {
      for (local_50 = plVar2[local_44]; local_50 != 0; local_50 = *(long *)(local_50 + 0x10)) {
        anon_unknown_14::calc_beta(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    dVar6 = (double)*(float *)(*(long *)(lVar3 + lVar4 * 8) + 0x54);
    (**(code **)(*in_RDI + 0x60))(dVar6);
    for (local_5c = 0; local_5c <= lVar4; local_5c = local_5c + 1) {
      for (local_68 = *(long *)(lVar3 + (long)local_5c * 8); local_68 != 0;
          local_68 = *(long *)(local_68 + 0x18)) {
        dVar7 = exp((double)(*(float *)(local_68 + 0x54) + *(float *)(local_68 + 0x58)) - dVar6);
        *(float *)(local_68 + 0x5c) = (float)dVar7;
        for (plVar2 = *(long **)(local_68 + 0x28); plVar2 != (long *)0x0; plVar2 = (long *)plVar2[3]
            ) {
          dVar7 = exp((-(double)fVar5 * (double)(int)plVar2[4] +
                       (double)*(float *)(plVar2[2] + 0x54) + (double)*(float *)(*plVar2 + 0x58)) -
                      dVar6);
          *(float *)((long)plVar2 + 0x24) = (float)dVar7;
        }
      }
    }
  }
  return true;
}

Assistant:

bool Viterbi::forwardbackward(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_MARGINAL_PROB)) {
    return true;
  }

  Node **end_node_list   = lattice->end_nodes();
  Node **begin_node_list = lattice->begin_nodes();

  const size_t len = lattice->size();
  const double theta = lattice->theta();

  end_node_list[0]->alpha = 0.0;
  for (int pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      calc_alpha(node, theta);
    }
  }

  begin_node_list[len]->beta = 0.0;
  for (int pos = static_cast<long>(len); pos >= 0; --pos) {
    for (Node *node = end_node_list[pos]; node; node = node->enext) {
      calc_beta(node, theta);
    }
  }

  const double Z = begin_node_list[len]->alpha;
  lattice->set_Z(Z);  // alpha of EOS

  for (int pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      node->prob = std::exp(node->alpha + node->beta - Z);
      for (Path *path = node->lpath; path; path = path->lnext) {
        path->prob = std::exp(path->lnode->alpha
                              - theta * path->cost
                              + path->rnode->beta - Z);
      }
    }
  }

  return true;
}